

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<elf_prpsinfo,_char> *jo)

{
  elf_prpsinfo *peVar1;
  ostream *poVar2;
  size_t sVar3;
  JObject *pJVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string fname;
  string args;
  int local_58;
  int local_54;
  JObject local_50;
  char local_3e [2];
  bool local_3c;
  char local_3b [11];
  
  peVar1 = jo->object;
  sVar3 = strnlen(peVar1->pr_fname,0x10);
  local_a0 = (undefined1  [8])&fname._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,peVar1->pr_fname,peVar1->pr_fname + sVar3);
  sVar3 = strnlen(peVar1->pr_psargs,0x50);
  fname.field_2._8_8_ = &args._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&fname.field_2 + 8),peVar1->pr_psargs,peVar1->pr_psargs + sVar3);
  local_50.sep = "";
  local_50.os = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  args.field_2._12_4_ = SEXT14(peVar1->pr_state);
  local_3e[0] = '\0';
  pJVar4 = JObject::field<char[9],int,char>
                     (&local_50,(char (*) [9])"pr_state",(int *)(args.field_2._M_local_buf + 0xc),
                      local_3e);
  local_c0.field_2._M_local_buf[0] = peVar1->pr_sname;
  local_c0._M_string_length = 1;
  local_c0.field_2._M_local_buf[1] = '\0';
  local_3e[1] = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pJVar4 = JObject::field<char[9],std::__cxx11::string,char>
                     (pJVar4,(char (*) [9])"pr_sname",&local_c0,local_3e + 1);
  local_3c = peVar1->pr_zomb != '\0';
  local_3b[0] = '\0';
  pJVar4 = JObject::field<char[8],bool,char>(pJVar4,(char (*) [8])"pr_zomb",&local_3c,local_3b);
  local_58 = (int)peVar1->pr_nice;
  local_3b[1] = 0;
  pJVar4 = JObject::field<char[8],int,char>(pJVar4,(char (*) [8])"pr_nice",&local_58,local_3b + 1);
  local_54 = (int)peVar1->pr_flag;
  local_3b[2] = 0;
  pJVar4 = JObject::field<char[8],int,char>(pJVar4,(char (*) [8])"pr_flag",&local_54,local_3b + 2);
  local_3b[3] = 0;
  pJVar4 = JObject::field<char[7],unsigned_int,char>
                     (pJVar4,(char (*) [7])"pr_uid",&peVar1->pr_uid,local_3b + 3);
  local_3b[4] = 0;
  pJVar4 = JObject::field<char[7],unsigned_int,char>
                     (pJVar4,(char (*) [7])"pr_gid",&peVar1->pr_gid,local_3b + 4);
  local_3b[5] = 0;
  pJVar4 = JObject::field<char[7],int,char>
                     (pJVar4,(char (*) [7])"pr_pid",&peVar1->pr_pid,local_3b + 5);
  local_3b[6] = 0;
  pJVar4 = JObject::field<char[8],int,char>
                     (pJVar4,(char (*) [8])"pr_ppid",&peVar1->pr_ppid,local_3b + 6);
  local_3b[7] = 0;
  pJVar4 = JObject::field<char[8],int,char>
                     (pJVar4,(char (*) [8])"pr_pgrp",&peVar1->pr_pgrp,local_3b + 7);
  local_3b[8] = 0;
  pJVar4 = JObject::field<char[7],int,char>
                     (pJVar4,(char (*) [7])"pr_sid",&peVar1->pr_sid,local_3b + 8);
  local_3b[9] = 0;
  pJVar4 = JObject::field<char[9],std::__cxx11::string,char>
                     (pJVar4,(char (*) [9])"pr_fname",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                      local_3b + 9);
  local_3b[10] = 0;
  pJVar4 = JObject::field<char[8],std::__cxx11::string,char>
                     (pJVar4,(char (*) [8])"pr_args",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&fname.field_2 + 8),local_3b + 10);
  poVar2 = pJVar4->os;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT62(local_c0.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_c0.field_2._M_local_buf[1],
                                      local_c0.field_2._M_local_buf[0])) + 1);
  }
  JObject::~JObject(&local_50);
  if ((size_type *)fname.field_2._8_8_ != &args._M_string_length) {
    operator_delete((void *)fname.field_2._8_8_,args._M_string_length + 1);
  }
  if (local_a0 != (undefined1  [8])&fname._M_string_length) {
    operator_delete((void *)local_a0,fname._M_string_length + 1);
  }
  return poVar2;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<prpsinfo_t> &jo)
{
    auto &pr = jo.object;

    std::string fname = { pr.pr_fname, strnlen( pr.pr_fname, sizeof pr.pr_fname ) };
    std::string args = { pr.pr_psargs, strnlen( pr.pr_psargs, sizeof pr.pr_psargs ) };

    return JObject(os)
        .field("pr_state", int( pr.pr_state ) )
        .field("pr_sname", std::string(&pr.pr_sname, 1))
        .field("pr_zomb", bool(pr.pr_zomb))
        .field("pr_nice", int (pr.pr_nice))
        .field("pr_flag", int(pr.pr_flag))
        .field("pr_uid", pr.pr_uid )
        .field("pr_gid", pr.pr_gid )
        .field("pr_pid", pr.pr_pid )
        .field("pr_ppid", pr.pr_ppid )
        .field("pr_pgrp", pr.pr_pgrp )
        .field("pr_sid", pr.pr_sid )
        .field("pr_fname", fname )
        .field("pr_args", args )
              ;
}